

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

_Bool react_to_slay(object *obj,monster *mon)

{
  _Bool _Var1;
  slay_conflict *s;
  wchar_t i;
  monster *mon_local;
  object *obj_local;
  
  if (obj->slays != (_Bool *)0x0) {
    for (s._4_4_ = 0; s._4_4_ < (int)(uint)z_info->slay_max; s._4_4_ = s._4_4_ + 1) {
      if (((obj->slays[s._4_4_] & 1U) != 0) &&
         (_Var1 = react_to_specific_slay(slays + s._4_4_,mon), _Var1)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool react_to_slay(struct object *obj, const struct monster *mon)
{
	int i;

	if (!obj->slays) return false;

	for (i = 0; i < z_info->slay_max; i++) {
		struct slay *s = &slays[i];
		if (obj->slays[i] && react_to_specific_slay(s, mon)) {
			return true;
		}
	}

	return false;
}